

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_ToOctString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToOctString_Test *this)

{
  AssertionResult iutest_ar;
  iuCodeMessage local_2d0;
  Fixed local_2a0;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iutest::detail::ToOctString<unsigned_char>(&local_38,'\0');
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"000\"","::iutest::detail::ToOctString< ::iutest::UInt8 >(0)",
             "000",(char *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd7,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<unsigned_short>(&local_58,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt16 >(0)","000000",(char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd8,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<unsigned_int>(&local_78,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"00000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt32 >(0)","00000000000",(char *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd9,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<unsigned_long>(&local_98,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"0000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt64 >(0)","0000000000000000000000",
             (char *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xda,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<long>(&local_b8,-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"1777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >(-1)","1777777777777777777777",
             (char *)&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b8);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xdb,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<long>(&local_d8,0x7fffffffffffffff);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"0777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((9223372036854775807L))",
             "0777777777777777777777",(char *)&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d8);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xdd,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<long>(&local_f8,-0x8000000000000000);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"1000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "1000000000000000000000",(char *)&local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f8);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xde,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToOctString<unsigned_char>(&local_118,0xff);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"377\"",
             "::iutest::detail::ToOctString< ::iutest::UInt8 >(0377u)","377",(char *)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xe0,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, ToOctString)
{
    IUTEST_EXPECT_STREQ(                   "000", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(                "000000", ::iutest::detail::ToOctString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(           "00000000000", ::iutest::detail::ToOctString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000000000", ::iutest::detail::ToOctString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("1777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("0777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("1000000000000000000000", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(                   "377", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0377u));
}